

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  float *pfVar1;
  undefined4 *puVar2;
  XML *this_00;
  _Alloc_hider __nptr;
  int iVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  AffineSpace3ff *pAVar7;
  TransformNode *pTVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  runtime_error *this_01;
  long *plVar10;
  undefined8 uVar11;
  uint uVar12;
  long *in_RDX;
  XMLLoader *pXVar13;
  char *pcVar14;
  ulong uVar15;
  string str_time_steps;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  XMLLoader *local_a0;
  Ref<embree::XML> *local_98;
  avector<AffineSpace3ff> local_90;
  string local_70;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_e8._0_8_ = &local_d8;
  local_98 = xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"time_steps","");
  XML::parm(&local_70,this_00,(string *)&local_e8.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._0_8_ != &local_d8) {
    operator_delete((void *)local_e8._0_8_);
  }
  local_a0 = this;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  __nptr._M_p = local_70._M_dataplus._M_p;
  if (iVar3 == 0) {
    uVar12 = 1;
LAB_00189b96:
    uVar15 = (ulong)uVar12;
    local_90.size_active = 0;
    local_90.size_alloced = 0;
    local_90.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    local_90.items =
         (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(uVar15 << 6,0x10);
    lVar6 = 0;
    local_a8 = 0;
    local_90.size_active = uVar15;
    local_90.size_alloced = uVar15;
    do {
      pcVar14 = "AffineSpace";
      iVar3 = std::__cxx11::string::compare
                        ((char *)(*(long *)(*(long *)(*in_RDX + 0x80) + lVar6) + 0x30));
      if (iVar3 == 0) {
        load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                  ((AffineSpace3fa *)&local_e8.field_1,(XMLLoader *)pcVar14,
                   (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar6));
      }
      else {
        pcVar14 = "Quaternion";
        iVar3 = std::__cxx11::string::compare
                          ((char *)(*(long *)(*(long *)(*in_RDX + 0x80) + lVar6) + 0x30));
        if (iVar3 != 0) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_e8._0_8_ = *plVar10;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ == paVar9) {
            local_d8._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_d8._8_8_ = plVar10[3];
            local_e8._0_8_ = &local_d8;
          }
          else {
            local_d8._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_e8._8_8_ = plVar10[1];
          *plVar10 = (long)paVar9;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::runtime_error::runtime_error(this_01,(string *)&local_e8.field_1);
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pAVar7 = loadQuaternion((AffineSpace3ff *)&local_e8.field_1,(XMLLoader *)pcVar14,
                                (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar6));
        local_a8 = CONCAT71((int7)((ulong)pAVar7 >> 8),1);
      }
      pfVar1 = (float *)((long)&((local_90.items)->l).vx.field_0 + lVar6 * 8);
      *pfVar1 = local_e8.m128[0];
      pfVar1[1] = local_e8.m128[1];
      pfVar1[2] = local_e8.m128[2];
      pfVar1[3] = local_e8.m128[3];
      puVar2 = (undefined4 *)((long)&((local_90.items)->l).vy.field_0 + lVar6 * 8);
      *puVar2 = local_d8._M_allocated_capacity._0_4_;
      puVar2[1] = local_d8._M_allocated_capacity._4_4_;
      puVar2[2] = local_d8._8_4_;
      puVar2[3] = local_d8._12_4_;
      puVar2 = (undefined4 *)((long)&((local_90.items)->l).vz.field_0 + lVar6 * 8);
      *puVar2 = local_c8;
      puVar2[1] = uStack_c4;
      puVar2[2] = uStack_c0;
      puVar2[3] = uStack_bc;
      puVar2 = (undefined4 *)((long)&((local_90.items)->p).field_0 + lVar6 * 8);
      *puVar2 = local_b8;
      puVar2[1] = uStack_b4;
      puVar2[2] = uStack_b0;
      puVar2[3] = uStack_ac;
      lVar6 = lVar6 + 8;
    } while (uVar15 * 8 - lVar6 != 0);
    if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3 == (ulong)(uVar12 + 1)) {
      pTVar8 = (TransformNode *)alignedMalloc(0xa0,0x10);
      pXVar13 = local_a0;
      loadNode((XMLLoader *)&local_e8.field_1,local_98);
      SceneGraph::TransformNode::TransformNode
                (pTVar8,&local_90,(Ref<embree::SceneGraph::Node> *)&local_e8.field_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_e8._0_8_ + 0x18))();
      }
      (pTVar8->spaces).quaternion = (bool)((byte)local_a8 & 1);
      (pXVar13->path).filename._M_dataplus._M_p = (pointer)pTVar8;
      (**(code **)((long)(pTVar8->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar8);
    }
    else {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)operator_new(0x80);
      SceneGraph::GroupNode::GroupNode((GroupNode *)paVar9,0);
      (**(code **)(paVar9->_M_allocated_capacity + 0x10))(paVar9);
      if (uVar15 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3)) {
        do {
          loadNode((XMLLoader *)&local_e8.field_1,local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::
            vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
            ::push_back((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                         *)(paVar9->_M_local_buf + 0x68),(value_type *)&local_e8.field_1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_e8._0_8_ + 0x18))();
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
      }
      pTVar8 = (TransformNode *)alignedMalloc(0xa0,0x10);
      pXVar13 = local_a0;
      local_e8._0_8_ = paVar9;
      (**(code **)(paVar9->_M_allocated_capacity + 0x10))(paVar9);
      SceneGraph::TransformNode::TransformNode
                (pTVar8,&local_90,(Ref<embree::SceneGraph::Node> *)&local_e8.field_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_e8._0_8_ + 0x18))();
      }
      (pTVar8->spaces).quaternion = (bool)((byte)local_a8 & 1);
      (pXVar13->path).filename._M_dataplus._M_p = (pointer)pTVar8;
      (**(code **)((long)(pTVar8->super_Node).super_RefCount._vptr_RefCount + 0x10))(pTVar8);
      (**(code **)(paVar9->_M_allocated_capacity + 0x18))(paVar9);
    }
    alignedFree(local_90.items);
    local_90.size_active = 0;
    local_90.size_alloced = 0;
    local_90.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)pXVar13;
  }
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(__nptr._M_p,(char **)&local_e8,10);
  if ((pointer)local_e8._0_8_ == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar4 = (uint)lVar6;
    if (((int)uVar4 == lVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      uVar12 = 1;
      if (1 < (int)uVar4) {
        uVar12 = uVar4;
      }
      goto LAB_00189b96;
    }
  }
  uVar11 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar11);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    AffineSpace3ff space;
    avector<AffineSpace3ff> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      AffineSpace3ff space;
      if (xml->children[i]->name == "AffineSpace") {
        space = (AffineSpace3ff) load<AffineSpace3fa>(xml->children[i]);
        spaces[j++] = space;
      }
      else if (xml->children[i]->name == "Quaternion") {
        space = loadQuaternion(xml->children[i]);
        quaternion = true;
        spaces[j++] = space;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);
    
    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::TransformNode(spaces,loadNode(xml->children[time_steps]));
      node->spaces.quaternion = quaternion;
      return node;
    }
  
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));
    
    auto node = new  SceneGraph::TransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    node->spaces.quaternion = quaternion;
    return node;
  }